

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaTypeFixup(xmlSchemaTypePtr type,xmlSchemaAbstractCtxtPtr actxt)

{
  xmlSchemaAbstractCtxtPtr actxt_local;
  xmlSchemaTypePtr type_local;
  
  if (type == (xmlSchemaTypePtr)0x0) {
    type_local._4_4_ = 0;
  }
  else if (actxt->type == 1) {
    if ((type->type == XML_SCHEMA_TYPE_BASIC) || ((type->flags & 0x400000U) != 0)) {
      type_local._4_4_ = 0;
    }
    else if (type->type == XML_SCHEMA_TYPE_COMPLEX) {
      type_local._4_4_ = xmlSchemaFixupComplexType((xmlSchemaParserCtxtPtr)actxt,type);
    }
    else if (type->type == XML_SCHEMA_TYPE_SIMPLE) {
      type_local._4_4_ = xmlSchemaFixupSimpleTypeStageTwo((xmlSchemaParserCtxtPtr)actxt,type);
    }
    else {
      type_local._4_4_ = 0;
    }
  }
  else {
    xmlSchemaInternalErr(actxt,"xmlSchemaTypeFixup","this function needs a parser context");
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

static int
xmlSchemaTypeFixup(xmlSchemaTypePtr type,
                   xmlSchemaAbstractCtxtPtr actxt)
{
    if (type == NULL)
        return(0);
    if (actxt->type != XML_SCHEMA_CTXT_PARSER) {
	AERROR_INT("xmlSchemaTypeFixup",
	    "this function needs a parser context");
	return(-1);
    }
    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);
    if (type->type == XML_SCHEMA_TYPE_COMPLEX)
	return(xmlSchemaFixupComplexType(PCTXT_CAST actxt, type));
    else if (type->type == XML_SCHEMA_TYPE_SIMPLE)
	return(xmlSchemaFixupSimpleTypeStageTwo(PCTXT_CAST actxt, type));
    return(0);
}